

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall cmGraphVizWriter::WriteTargetDependersFiles(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  TargetType targetType;
  ostream *poVar3;
  _Base_ptr p_Var4;
  cmGraphVizWriter *this_00;
  char cVar5;
  string currentFilename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  cmGeneratedFileStream str;
  string local_300;
  char *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  long local_278 [4];
  byte abStack_258 [552];
  
  if (this->GenerateDependers == true) {
    local_2e0 = fileName;
    CollectTargetsAndLibs(this);
    p_Var4 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        cVar5 = '\x03';
        if (*(cmGeneratorTarget **)(p_Var4 + 2) != (cmGeneratorTarget *)0x0) {
          targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var4 + 2));
          bVar2 = GenerateForTargetType(this,targetType);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_300,local_2e0,(allocator<char> *)local_278);
            std::__cxx11::string::append((char *)&local_300);
            std::__cxx11::string::_M_append((char *)&local_300,*(ulong *)(p_Var4 + 1));
            std::__cxx11::string::append((char *)&local_300);
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)local_278,&local_300,false,None);
            cVar5 = (abStack_258[*(long *)(local_278[0] + -0x18)] & 5) != 0;
            if (!(bool)cVar5) {
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2a8._M_impl.super__Rb_tree_header._M_header;
              local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2d8._M_impl.super__Rb_tree_header._M_header;
              local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
              local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8)
              ;
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_300._M_dataplus._M_p,
                                  local_300._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"...",3);
              std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
              std::ostream::put((char)poVar3);
              std::ostream::flush();
              WriteHeader(this,(cmGeneratedFileStream *)local_278);
              this_00 = this;
              WriteDependerConnections
                        (this,(string *)(p_Var4 + 1),
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2d8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2a8,(cmGeneratedFileStream *)local_278);
              WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2d8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_2a8);
            }
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((cVar5 != '\x03') && (cVar5 != '\0')) {
          return;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteTargetDependersFiles(const char* fileName)
{
  if (!this->GenerateDependers) {
    return;
  }

  this->CollectTargetsAndLibs();

  for (auto const& ptr : this->TargetPtrs) {
    if (ptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(ptr.second->GetType())) {
      continue;
    }

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptr.first;
    currentFilename += ".dependers";

    cmGeneratedFileStream str(currentFilename);
    if (!str) {
      return;
    }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteDependerConnections(ptr.first, insertedNodes,
                                   insertedConnections, str);

    this->WriteFooter(str);
  }
}